

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

QJsonValue * QJsonValue::fromVariant(QJsonValue *__return_storage_ptr__,QVariant *variant)

{
  PrivateShared *pPVar1;
  bool bVar2;
  int iVar3;
  QMetaType QVar4;
  qlonglong v;
  qulonglong qVar5;
  long in_FS_OFFSET;
  double v_00;
  QJsonDocument doc;
  QCborMap local_68;
  QJsonArray local_60;
  undefined1 local_58 [32];
  anon_union_24_3_e3d07ef4_for_data local_38;
  
  local_38._16_8_ = *(long *)(in_FS_OFFSET + 0x28);
  QVar4 = ::QVariant::metaType(variant);
  if (QVar4.d_ptr == (QMetaTypeInterface *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = ((QVar4.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar3 == 0) {
      iVar3 = QMetaType::registerHelper(QVar4.d_ptr);
    }
  }
  switch(iVar3) {
  case 1:
    bVar2 = ::QVariant::toBool(variant);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38._16_8_) {
      QJsonValue(__return_storage_ptr__,bVar2);
      return __return_storage_ptr__;
    }
    goto LAB_002fc10b;
  case 2:
  case 3:
  case 4:
  case 0x20:
  case 0x21:
  case 0x24:
    goto switchD_002fb919_caseD_2;
  case 5:
  case 0x23:
    qVar5 = ::QVariant::toULongLong(variant,(bool *)0x0);
    if ((long)qVar5 < 0) goto switchD_002fb919_caseD_6;
    goto switchD_002fb919_caseD_2;
  case 6:
  case 0x26:
  case 0x3f:
switchD_002fb919_caseD_6:
    v_00 = ::QVariant::toDouble(variant,(bool *)0x0);
    if ((ulong)ABS(v_00) < 0x7ff0000000000000) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38._16_8_) {
        QJsonValue(__return_storage_ptr__,v_00);
        return __return_storage_ptr__;
      }
      goto LAB_002fc10b;
    }
  case 0x33:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38._16_8_) {
      QJsonValue(__return_storage_ptr__,Null);
      return __return_storage_ptr__;
    }
    goto LAB_002fc10b;
  default:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toString((QString *)local_58,variant);
    if ((undefined1 *)local_58._16_8_ == (undefined1 *)0x0) {
      QJsonValue(__return_storage_ptr__,Null);
    }
    else {
      QJsonValue(__return_storage_ptr__,(QString *)local_58);
    }
    goto LAB_002fbf3e;
  case 8:
    ::QVariant::toMap((QVariant *)&local_38);
    QJsonObject::fromVariantMap((QJsonObject *)local_58,(QVariantMap *)&local_38);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)local_58);
    QJsonObject::~QJsonObject((QJsonObject *)local_58);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                *)&local_38);
    break;
  case 9:
    ::QVariant::toList((QVariantList *)local_58,variant);
    QJsonArray::fromVariantList((QJsonArray *)&local_38,(QVariantList *)local_58);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_38);
    QJsonArray::~QJsonArray((QJsonArray *)&local_38);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_58);
    break;
  case 10:
    ::QVariant::toString((QString *)local_58,variant);
    QJsonValue(__return_storage_ptr__,(QString *)local_58);
    goto LAB_002fbf3e;
  case 0xb:
    ::QVariant::toStringList((QStringList *)local_58,variant);
    QJsonArray::fromStringList((QJsonArray *)&local_38,(QStringList *)local_58);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_38);
    QJsonArray::~QJsonArray((QJsonArray *)&local_38);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
    break;
  case 0x11:
    ::QVariant::toUrl((QVariant *)&local_38);
    QUrl::toString((QString *)local_58,(QUrl *)&local_38,(FormattingOptions)0x1f00000);
    QJsonValue(__return_storage_ptr__,(QString *)local_58);
    if ((QMetaTypeInterface *)local_58._0_8_ != (QMetaTypeInterface *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    QUrl::~QUrl((QUrl *)&local_38);
    break;
  case 0x1c:
    ::QVariant::toHash((QVariant *)&local_38);
    QJsonObject::fromVariantHash((QJsonObject *)local_58,(QVariantHash *)&local_38);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)local_58);
    QJsonObject::~QJsonObject((QJsonObject *)local_58);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&local_38);
    break;
  case 0x1e:
    local_38._0_16_ = (undefined1  [16])::QVariant::toUuid(variant);
    QUuid::toString((QString *)local_58,(QUuid *)&local_38,WithoutBraces);
    QJsonValue(__return_storage_ptr__,(QString *)local_58);
LAB_002fbf3e:
    if ((QMetaTypeInterface *)local_58._0_8_ != (QMetaTypeInterface *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    break;
  case 0x2d:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38._16_8_) {
      ::QVariant::toJsonValue(__return_storage_ptr__,variant);
      return __return_storage_ptr__;
    }
    goto LAB_002fc10b;
  case 0x2e:
    ::QVariant::toJsonObject((QVariant *)local_58);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)local_58);
    QJsonObject::~QJsonObject((QJsonObject *)local_58);
    break;
  case 0x2f:
    ::QVariant::toJsonArray((QVariant *)local_58);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)local_58);
    QJsonArray::~QJsonArray((QJsonArray *)local_58);
    break;
  case 0x30:
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toJsonDocument((QVariant *)local_58);
    bVar2 = QJsonDocument::isArray((QJsonDocument *)local_58);
    if (bVar2) {
      QJsonDocument::array((QJsonDocument *)&local_38);
      QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_38);
    }
    else {
      QJsonDocument::object((QJsonDocument *)&local_38);
      QJsonValue(__return_storage_ptr__,(QJsonObject *)&local_38);
    }
    if (bVar2) {
      QJsonArray::~QJsonArray((QJsonArray *)&local_38);
    }
    else {
      QJsonObject::~QJsonObject((QJsonObject *)&local_38);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)local_58);
    break;
  case 0x35:
    local_38.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QCborValue>::metaType;
    local_60.a.d.ptr =
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = ::comparesEqual((QMetaType *)&local_60,(QMetaType *)&local_38);
    if (bVar2) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QCborValue::QCborValue((QCborValue *)local_58,(QCborValue *)variant);
    }
    else {
      local_58._0_16_ = (undefined1  [16])0x0;
      local_58._16_8_ = (undefined1 *)0xaaaaaaaa00000117;
      QVar4 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar4,variant,(QMetaType)local_38.shared,local_58);
    }
    QCborValue::toJsonValue(__return_storage_ptr__,(QCborValue *)local_58);
    QCborValue::~QCborValue((QCborValue *)local_58);
    break;
  case 0x36:
    local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCborArray>::metaType;
    local_38.shared = (PrivateShared *)(*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = ::comparesEqual((QMetaType *)&local_38,(QMetaType *)local_58);
    if (bVar2) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QCborArray::QCborArray((QCborArray *)&local_68,(QCborArray *)variant);
    }
    else {
      local_68.d.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QCborArray::QCborArray((QCborArray *)&local_68);
      QVar4 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar4,variant,(QMetaType)local_58._0_8_,&local_68);
    }
    QCborArray::toJsonArray((QCborArray *)&local_60);
    QJsonValue(__return_storage_ptr__,&local_60);
    QJsonArray::~QJsonArray(&local_60);
    QCborArray::~QCborArray((QCborArray *)&local_68);
    break;
  case 0x37:
    local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCborMap>::metaType;
    local_38.shared = (PrivateShared *)(*(ulong *)&(variant->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = ::comparesEqual((QMetaType *)&local_38,(QMetaType *)local_58);
    if (bVar2) {
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QCborMap::QCborMap(&local_68,(QCborMap *)variant);
    }
    else {
      local_68.d.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QCborMap::QCborMap(&local_68);
      QVar4 = ::QVariant::metaType(variant);
      if (((variant->d).field_0x18 & 1) != 0) {
        pPVar1 = (variant->d).data.shared;
        variant = (QVariant *)
                  ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                          _q_value.super___atomic_base<int> + (long)pPVar1->offset);
      }
      QMetaType::convert(QVar4,variant,(QMetaType)local_58._0_8_,&local_68);
    }
    QCborMap::toJsonObject((QCborMap *)&local_60);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)&local_60);
    QJsonObject::~QJsonObject((QJsonObject *)&local_60);
    QCborMap::~QCborMap(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38._16_8_) {
    return __return_storage_ptr__;
  }
LAB_002fc10b:
  __stack_chk_fail();
switchD_002fb919_caseD_2:
  v = ::QVariant::toLongLong(variant,(bool *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38._16_8_) {
    QJsonValue(__return_storage_ptr__,v);
    return __return_storage_ptr__;
  }
  goto LAB_002fc10b;
}

Assistant:

QJsonValue QJsonValue::fromVariant(const QVariant &variant)
{
    switch (variant.metaType().id()) {
    case QMetaType::Nullptr:
        return QJsonValue(Null);
    case QMetaType::Bool:
        return QJsonValue(variant.toBool());
    case QMetaType::Short:
    case QMetaType::UShort:
    case QMetaType::Int:
    case QMetaType::UInt:
    case QMetaType::Long:
    case QMetaType::LongLong:
        return QJsonValue(variant.toLongLong());
    case QMetaType::ULong:
    case QMetaType::ULongLong:
        if (variant.toULongLong() <= static_cast<uint64_t>(std::numeric_limits<qint64>::max()))
            return QJsonValue(variant.toLongLong());
        Q_FALLTHROUGH();
    case QMetaType::Float16:
    case QMetaType::Float:
    case QMetaType::Double: {
        double v = variant.toDouble();
        return qt_is_finite(v) ? QJsonValue(v) : QJsonValue();
    }
    case QMetaType::QString:
        return QJsonValue(variant.toString());
    case QMetaType::QStringList:
        return QJsonValue(QJsonArray::fromStringList(variant.toStringList()));
    case QMetaType::QVariantList:
        return QJsonValue(QJsonArray::fromVariantList(variant.toList()));
    case QMetaType::QVariantMap:
        return QJsonValue(QJsonObject::fromVariantMap(variant.toMap()));
    case QMetaType::QVariantHash:
        return QJsonValue(QJsonObject::fromVariantHash(variant.toHash()));
#ifndef QT_BOOTSTRAPPED
    case QMetaType::QUrl:
        return QJsonValue(variant.toUrl().toString(QUrl::FullyEncoded));
    case QMetaType::QUuid:
        return variant.toUuid().toString(QUuid::WithoutBraces);
    case QMetaType::QJsonValue:
        return variant.toJsonValue();
    case QMetaType::QJsonObject:
        return variant.toJsonObject();
    case QMetaType::QJsonArray:
        return variant.toJsonArray();
    case QMetaType::QJsonDocument: {
        QJsonDocument doc = variant.toJsonDocument();
        return doc.isArray() ? QJsonValue(doc.array()) : QJsonValue(doc.object());
    }
    case QMetaType::QCborValue:
        return qvariant_cast<QCborValue>(variant).toJsonValue();
    case QMetaType::QCborArray:
        return qvariant_cast<QCborArray>(variant).toJsonArray();
    case QMetaType::QCborMap:
        return qvariant_cast<QCborMap>(variant).toJsonObject();
#endif
    default:
        break;
    }
    QString string = variant.toString();
    if (string.isEmpty())
        return QJsonValue();
    return QJsonValue(string);
}